

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O0

Bit32u __thiscall OPL::DOSBox::DBOPL::Chip::WriteAddr(Chip *this,Bit32u port,Bit8u val)

{
  Bit8u val_local;
  Bit32u port_local;
  Chip *this_local;
  
  if ((port & 3) == 0) {
    this_local._4_4_ = (uint)val;
  }
  else if ((port & 3) == 2) {
    if ((this->opl3Active == '\0') && (val != '\x05')) {
      this_local._4_4_ = (uint)val;
    }
    else {
      this_local._4_4_ = val | 0x100;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

Bit32u Chip::WriteAddr( Bit32u port, Bit8u val ) {
	switch ( port & 3 ) {
	case 0:
		return val;
	case 2:
		if ( opl3Active || (val == 0x05) )
			return 0x100 | val;
		else
			return val;
	}
	return 0;
}